

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

TimerId __thiscall
mario::TimerQueue::addTimer(TimerQueue *this,TimerCallback *cb,Timestamp when,double interval)

{
  EventLoop *this_00;
  TimerId TVar1;
  Functor local_60;
  _Bind<void_(mario::TimerQueue::*(mario::TimerQueue_*,_mario::Timer_*))(mario::Timer_*)> local_40;
  
  TVar1._value = (Timer *)operator_new(0x40);
  Timer::Timer(TVar1._value,cb,when,interval);
  this_00 = this->_loop;
  local_40._M_f = (offset_in_TimerQueue_to_subr)addTimerInLoop;
  local_40._8_8_ = 0;
  local_40._M_bound_args.super__Tuple_impl<0UL,_mario::TimerQueue_*,_mario::Timer_*>.
  super__Tuple_impl<1UL,_mario::Timer_*>.super__Head_base<1UL,_mario::Timer_*,_false>._M_head_impl =
       (_Head_base<1UL,_mario::Timer_*,_false>)(_Head_base<1UL,_mario::Timer_*,_false>)TVar1._value;
  local_40._M_bound_args.super__Tuple_impl<0UL,_mario::TimerQueue_*,_mario::Timer_*>.
  super__Head_base<0UL,_mario::TimerQueue_*,_false>._M_head_impl = this;
  std::function<void()>::
  function<std::_Bind<void(mario::TimerQueue::*(mario::TimerQueue*,mario::Timer*))(mario::Timer*)>,void>
            ((function<void()> *)&local_60,&local_40);
  EventLoop::runInLoop(this_00,&local_60);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  TVar1._seq = (TVar1._value)->_sequence;
  return TVar1;
}

Assistant:

TimerId TimerQueue::addTimer(const TimerCallback& cb, Timestamp when, double interval) {
    Timer* timer = new Timer(cb, when, interval);
    _loop->runInLoop(
            std::bind(&TimerQueue::addTimerInLoop, this, timer)
            );

    return TimerId(timer, timer->sequence());
}